

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void * radio_donew(t_symbol *s,int argc,t_atom *argv,int old)

{
  int iVar1;
  t_iemgui *iemgui;
  _glist *p_Var2;
  t_float tVar3;
  int local_9c;
  undefined1 local_88 [8];
  t_iemgui_drawfunctions w;
  t_float fval;
  int fs;
  int num;
  int chg;
  int ldy;
  int ldx;
  int on;
  int a;
  t_radio *x;
  int old_local;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  iemgui = iemgui_new(radio_class);
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldx = iVar1 + 5;
  chg = 0;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  num = (int)((double)((iVar1 + 5) * -8) / 15.0);
  fs = 1;
  fval = 1.12104e-44;
  w.draw_move._4_4_ = iemgui->x_fontsize;
  w.draw_move._0_4_ = 0.0;
  if (*s->s_name == 'v') {
    *(undefined4 *)&iemgui[1].x_obj.te_outlet = 1;
  }
  *(int *)((long)&iemgui[1].x_obj.te_outlet + 4) = old;
  local_88 = (undefined1  [8])radio_draw_new;
  w.draw_new = radio_draw_config;
  w.draw_config = radio_draw_io;
  w.draw_iolets = radio_draw_update;
  w.draw_update = radio_draw_select;
  w.draw_select = (t_iemdrawfunptr)0x0;
  w.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,(t_iemgui_drawfunctions *)local_88);
  if (((((((argc == 0xf) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
        (((argv[2].a_type == A_FLOAT && (argv[3].a_type == A_FLOAT)) &&
         ((argv[4].a_type == A_SYMBOL || (argv[4].a_type == A_FLOAT)))))) &&
       ((argv[5].a_type == A_SYMBOL || (argv[5].a_type == A_FLOAT)))) &&
      ((argv[6].a_type == A_SYMBOL || (argv[6].a_type == A_FLOAT)))) &&
     ((((argv[7].a_type == A_FLOAT && (argv[8].a_type == A_FLOAT)) && (argv[9].a_type == A_FLOAT))
      && ((argv[10].a_type == A_FLOAT && (argv[0xe].a_type == A_FLOAT)))))) {
    tVar3 = atom_getfloatarg(0,0xf,argv);
    ldx = (int)tVar3;
    tVar3 = atom_getfloatarg(1,0xf,argv);
    fs = (int)tVar3;
    tVar3 = atom_getfloatarg(2,0xf,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar3);
    tVar3 = atom_getfloatarg(3,0xf,argv);
    fval = (t_float)(int)tVar3;
    iemgui_new_getnames(iemgui,4,argv);
    tVar3 = atom_getfloatarg(7,0xf,argv);
    chg = (int)tVar3;
    tVar3 = atom_getfloatarg(8,0xf,argv);
    num = (int)tVar3;
    tVar3 = atom_getfloatarg(9,0xf,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar3);
    tVar3 = atom_getfloatarg(10,0xf,argv);
    w.draw_move._4_4_ = (int)tVar3;
    iemgui_all_loadcolors(iemgui,argv + 0xb,argv + 0xc,argv + 0xd);
    w.draw_move._0_4_ = atom_getfloatarg(0xe,0xf,argv);
  }
  else {
    iemgui_new_getnames(iemgui,4,(t_atom *)0x0);
  }
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffff7f | (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7);
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffffbf | (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6);
  if (((uint)iemgui->x_fsf & 0x3f) == 1) {
    strcpy(iemgui->x_font,"helvetica");
  }
  else if (((uint)iemgui->x_fsf & 0x3f) == 2) {
    strcpy(iemgui->x_font,"times");
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffc0);
    strcpy(iemgui->x_font,sys_font);
  }
  if ((int)fval < 1) {
    fval = 1.4013e-45;
  }
  if (0x80 < (int)fval) {
    fval = 1.79366e-43;
  }
  *(t_float *)((long)&iemgui[1].x_obj.te_g.g_next + 4) = fval;
  *(t_float *)((long)&iemgui[1].x_obj.te_binbuf + 4) = w.draw_move._0_4_;
  ldy = (int)w.draw_move._0_4_;
  if (ldy < 0) {
    ldy = 0;
  }
  if (*(int *)((long)&iemgui[1].x_obj.te_g.g_next + 4) <= ldy) {
    ldy = *(int *)((long)&iemgui[1].x_obj.te_g.g_next + 4) + -1;
  }
  if (((uint)iemgui->x_isa & 1) == 0) {
    *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 0;
  }
  else {
    *(int *)&iemgui[1].x_obj.te_g.g_pd = ldy;
  }
  *(undefined4 *)((long)&iemgui[1].x_obj.te_g.g_pd + 4) = *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd;
  *(uint *)&iemgui[1].x_obj.te_g.g_next = (uint)(fs != 0);
  if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = chg;
  iemgui->x_ldy = num;
  if (w.draw_move._4_4_ < 4) {
    local_9c = 4;
  }
  else {
    local_9c = w.draw_move._4_4_;
  }
  iemgui->x_fontsize = local_9c;
  iVar1 = iemgui_clip_size(ldx);
  iemgui->x_w = iVar1;
  iemgui->x_h = iemgui->x_w;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  outlet_new(&iemgui->x_obj,&s_list);
  return iemgui;
}

Assistant:

static void *radio_donew(t_symbol *s, int argc, t_atom *argv, int old)
{
    t_radio *x = (t_radio *)iemgui_new(radio_class);
    int a = IEM_GUI_DEFAULTSIZE, on = 0;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE, chg = 1, num = 8;
    int fs = x->x_gui.x_fontsize;
    t_float fval = 0;
    if('v' == *s->s_name)
        x->x_orientation = vertical;
    x->x_compat = old;

    IEMGUI_SETDRAWFUNCTIONS(x, radio);

    if((argc == 15)&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2)
       &&IS_A_FLOAT(argv,3)
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&(IS_A_SYMBOL(argv,5)||IS_A_FLOAT(argv,5))
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10)&&IS_A_FLOAT(argv,14))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        chg = (int)atom_getfloatarg(1, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(2, argc, argv));
        num = (int)atom_getfloatarg(3, argc, argv);
        iemgui_new_getnames(&x->x_gui, 4, argv);
        ldx = (int)atom_getfloatarg(7, argc, argv);
        ldy = (int)atom_getfloatarg(8, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(9, argc, argv));
        fs = (int)atom_getfloatarg(10, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+11, argv+12, argv+13);
        fval = atom_getfloatarg(14, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 4, 0);
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(num < 1)
        num = 1;
    if(num > IEM_RADIO_MAX)
        num = IEM_RADIO_MAX;
    x->x_number = num;
    x->x_fval = fval;
    on = fval;
    if(on < 0)
        on = 0;
    if(on >= x->x_number)
        on = x->x_number - 1;
    if(x->x_gui.x_isa.x_loadinit)
        x->x_on = on;
    else
        x->x_on = 0;
    x->x_on_old = x->x_on;
    x->x_change = (chg == 0) ? 0 : 1;
    if(x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_list);
    return (x);
}